

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SFormat lj_strfmt_parse(FormatState *fs)

{
  byte bVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  int local_38;
  uint32_t sx;
  uint32_t prec;
  uint32_t width;
  uint32_t c;
  SFormat sf;
  uint8_t *e;
  uint8_t *p;
  FormatState *fs_local;
  
  e = fs->p;
  fs->str = (char *)e;
  do {
    if (fs->e <= e) {
LAB_00121f96:
      fs->p = e;
LAB_00121fa1:
      fs->len = (int)e - (int)fs->str;
      if (fs->len == 0) {
        return 0;
      }
      return 2;
    }
    if (*e == '%') {
      if (e[1] == '%') {
        fs->p = e + 2;
        e = e + 1;
        goto LAB_00121fa1;
      }
      width = 0;
      puVar2 = e;
      if (e == (uint8_t *)fs->str) break;
      goto LAB_00121f96;
    }
    e = e + 1;
  } while( true );
LAB_00121d38:
  e = puVar2 + 1;
  if (0x10 < *e - 0x20) {
LAB_00121de5:
    if (*e - 0x30 < 10) {
      pbVar5 = puVar2 + 2;
      sx = *e - 0x30;
      e = pbVar5;
      if (*pbVar5 - 0x30 < 10) {
        e = puVar2 + 3;
        sx = (*pbVar5 - 0x30) + sx * 10;
      }
      width = sx << 0x10 | width;
    }
    if (*e == '.') {
      local_38 = 0;
      pbVar5 = e + 1;
      if (*pbVar5 - 0x30 < 10) {
        pbVar6 = e + 2;
        local_38 = *pbVar5 - 0x30;
        pbVar5 = pbVar6;
        if (*pbVar6 - 0x30 < 10) {
          local_38 = (*pbVar6 - 0x30) + local_38 * 10;
          pbVar5 = e + 3;
        }
      }
      e = pbVar5;
      width = (local_38 + 1) * 0x1000000 | width;
    }
    uVar3 = *e - 0x41;
    if ((uVar3 < 0x38) && (bVar1 = "\x05"[uVar3], bVar1 != 0)) {
      fs->p = e + 1;
      uVar4 = 0x2000;
      if ((uVar3 & 0x20) != 0) {
        uVar4 = 0;
      }
      fs_local._4_4_ = width | bVar1 | uVar4;
    }
    else {
      if (0x1f < *e) {
        e = e + 1;
      }
      fs->len = (int)e - (int)fs->str;
      fs->p = fs->e;
      fs_local._4_4_ = 1;
    }
    return fs_local._4_4_;
  }
  if (*e == '-') {
    width = width | 0x100;
    puVar2 = e;
  }
  else if (*e == '+') {
    width = width | 0x200;
    puVar2 = e;
  }
  else if (*e == '0') {
    width = width | 0x400;
    puVar2 = e;
  }
  else if (*e == ' ') {
    width = width | 0x800;
    puVar2 = e;
  }
  else {
    if (*e != '#') goto LAB_00121de5;
    width = width | 0x1000;
    puVar2 = e;
  }
  goto LAB_00121d38;
}

Assistant:

SFormat LJ_FASTCALL lj_strfmt_parse(FormatState *fs)
{
  const uint8_t *p = fs->p, *e = fs->e;
  fs->str = (const char *)p;
  for (; p < e; p++) {
    if (*p == '%') {  /* Escape char? */
      if (p[1] == '%') {  /* '%%'? */
	fs->p = ++p+1;
	goto retlit;
      } else {
	SFormat sf = 0;
	uint32_t c;
	if (p != (const uint8_t *)fs->str)
	  break;
	for (p++; (uint32_t)*p - ' ' <= (uint32_t)('0' - ' '); p++) {
	  /* Parse flags. */
	  if (*p == '-') sf |= STRFMT_F_LEFT;
	  else if (*p == '+') sf |= STRFMT_F_PLUS;
	  else if (*p == '0') sf |= STRFMT_F_ZERO;
	  else if (*p == ' ') sf |= STRFMT_F_SPACE;
	  else if (*p == '#') sf |= STRFMT_F_ALT;
	  else break;
	}
	if ((uint32_t)*p - '0' < 10) {  /* Parse width. */
	  uint32_t width = (uint32_t)*p++ - '0';
	  if ((uint32_t)*p - '0' < 10)
	    width = (uint32_t)*p++ - '0' + width*10;
	  sf |= (width << STRFMT_SH_WIDTH);
	}
	if (*p == '.') {  /* Parse precision. */
	  uint32_t prec = 0;
	  p++;
	  if ((uint32_t)*p - '0' < 10) {
	    prec = (uint32_t)*p++ - '0';
	    if ((uint32_t)*p - '0' < 10)
	      prec = (uint32_t)*p++ - '0' + prec*10;
	  }
	  sf |= ((prec+1) << STRFMT_SH_PREC);
	}
	/* Parse conversion. */
	c = (uint32_t)*p - 'A';
	if (LJ_LIKELY(c <= (uint32_t)('x' - 'A'))) {
	  uint32_t sx = strfmt_map[c];
	  if (sx) {
	    fs->p = p+1;
	    return (sf | sx | ((c & 0x20) ? 0 : STRFMT_F_UPPER));
	  }
	}
	/* Return error location. */
	if (*p >= 32) p++;
	fs->len = (MSize)(p - (const uint8_t *)fs->str);
	fs->p = fs->e;
	return STRFMT_ERR;
      }
    }
  }
  fs->p = p;
retlit:
  fs->len = (MSize)(p - (const uint8_t *)fs->str);
  return fs->len ? STRFMT_LIT : STRFMT_EOF;
}